

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# HighsMipAnalysis.cpp
# Opt level: O1

void __thiscall HighsMipAnalysis::mipTimerStop(HighsMipAnalysis *this,HighsInt mip_clock)

{
  int i_clock;
  pointer pbVar1;
  _Alloc_hider _Var2;
  string clock_name;
  undefined1 *local_40 [2];
  undefined1 local_30 [16];
  
  if (this->analyse_mip_time == true) {
    i_clock = (this->mip_clocks).clock_.super__Vector_base<int,_std::allocator<int>_>._M_impl.
              super__Vector_impl_data._M_start[mip_clock];
    if (i_clock == -4) {
      pbVar1 = (((this->mip_clocks).timer_pointer_)->clock_names).
               super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
               ._M_impl.super__Vector_impl_data._M_start;
      _Var2._M_p = pbVar1[-4]._M_dataplus._M_p;
      local_40[0] = local_30;
      std::__cxx11::string::_M_construct<char*>
                ((string *)local_40,_Var2._M_p,_Var2._M_p + pbVar1[-4]._M_string_length);
      printf("MipTimer: stopping clock %d: %s\n",0xfffffffc,local_40[0]);
      if (local_40[0] != local_30) {
        operator_delete(local_40[0]);
      }
    }
    HighsTimer::stop((this->mip_clocks).timer_pointer_,i_clock);
  }
  return;
}

Assistant:

void HighsMipAnalysis::mipTimerStop(const HighsInt mip_clock
                                    // , const HighsInt thread_id
) const {
  if (!analyse_mip_time) return;
  HighsInt highs_timer_clock = mip_clocks.clock_[mip_clock];
  if (highs_timer_clock == check_mip_clock) {
    std::string clock_name =
        mip_clocks.timer_pointer_->clock_names[check_mip_clock];
    printf("MipTimer: stopping clock %d: %s\n", int(check_mip_clock),
           clock_name.c_str());
  }
  mip_clocks.timer_pointer_->stop(highs_timer_clock);
}